

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle.hpp
# Opt level: O3

void MetaSim::attach_stat<Source::ProduceEvent,AvgQueueSizeStat>
               (AvgQueueSizeStat *s,ProduceEvent *e)

{
  pointer *__ptr;
  __uniq_ptr_impl<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
  .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl =
       (tuple<MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>)
       operator_new(0x18);
  *(undefined ***)
   local_18._M_t.
   super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
   .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl =
       &PTR__ParticleInterface_001246e0;
  *(ProduceEvent **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
          .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl + 8) = e;
  *(AvgQueueSizeStat **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
          .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl + 0x10) = s;
  Event::addParticle(&e->super_Event,
                     (unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
                      *)&local_18);
  if ((_Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
       )local_18._M_t.
        super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
        .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl !=
      (ParticleInterface *)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
                          .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl +
                8))();
  }
  return;
}

Assistant:

void attach_stat(StatClass &s, Evt &e) {
        std::unique_ptr< ParticleInterface > p(new Particle<Evt, StatClass>(e, s));
        e.addParticle(std::move(p));
    }